

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  MetaLog<deflog> *this;
  size_t i;
  unsigned_long args;
  string local_58;
  allocator<char> local_31;
  
  this = MetaLog<deflog>::GetInstance();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"/home/usr/test_log",&local_31);
  MetaLog<deflog>::Init(this,ERROR,'\x06',&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_58._M_dataplus._M_p = (pointer)0xf;
  local_58._M_string_length = 0x107061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_58,"A");
  local_58._M_dataplus._M_p = (pointer)0xf;
  local_58._M_string_length = 0x107061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_58,"A");
  local_58._M_dataplus._M_p = (pointer)0xf;
  local_58._M_string_length = 0x107061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_58,"A");
  local_58._M_dataplus._M_p = (pointer)0xf;
  local_58._M_string_length = 0x107061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_58,"B");
  local_58._M_dataplus._M_p = (pointer)0xf;
  local_58._M_string_length = 0x107061;
  MetaLog<deflog>::UniqueLog<char_const*>(this,ERROR,(string_view *)&local_58,"A");
  for (args = 0; args != 50000000; args = args + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,">>>>>>>>>>>> timed log %\n",&local_31);
    MetaLog<deflog>::TimedLog<unsigned_long>(this,ERROR,0,200,&local_58,args);
    std::__cxx11::string::~string((string *)&local_58);
    local_58._M_dataplus._M_p = (pointer)0x1a;
    local_58._M_string_length = 0x10708f;
    MetaLog<deflog>::Log<unsigned_long>(this,ERROR,(string_view *)&local_58,args);
  }
  MetaLog<deflog>::FlushStreams(this);
  return 0;
}

Assistant:

int main() {
    auto& metalog_instance = MetaLog<deflog>::GetInstance();
    metalog_instance.Init(deflog::ERROR, output::out | output::logfile, "/home/usr/test_log");
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // prints
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "B"); // prints
    metalog_instance.UniqueLog(deflog::ERROR, "the state is %\n", "A"); // nope
    for (size_t i = 0; i < 50000000; ++i) {
        metalog_instance.TimedLog(deflog::ERROR, 0, 200, ">>>>>>>>>>>> timed log %\n", i);
        metalog_instance.Log(deflog::ERROR, "<<<<<<<<<<<< normal log %\n", i);
    }
    metalog_instance.FlushStreams();
    return 0;
}